

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * kj::_::operator*(String *__return_storage_ptr__,long *param_2,undefined8 param_3,
                         undefined8 param_4,ArrayPtr<const_char> *param_5)

{
  long lVar1;
  char *pcVar2;
  long local_28;
  char *local_20;
  StringPtr local_18;
  
  lVar1 = ((long *)*param_2)[1];
  local_28 = lVar1;
  if (lVar1 != 0) {
    local_28 = *(long *)*param_2;
  }
  local_20 = (char *)(lVar1 + -1);
  if (lVar1 == 0) {
    local_20 = (char *)0x0;
  }
  pcVar2 = (char *)((long *)param_2[1])[1];
  local_18.content.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_18.content.ptr = *(char **)param_2[1];
  }
  local_18.content.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_18.content.size_ = (size_t)(char *)0x0;
  }
  concat<kj::ArrayPtr<char_const>,kj::StringPtr&,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)(param_2 + 2),&local_18,
             param_5);
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(DebugComparison<Left, Right>& cmp) {
  return _::concat(tryToCharSequence(&cmp.left), cmp.op, tryToCharSequence(&cmp.right));
}